

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationTorque.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMotorRotationTorque::ConstraintsFbLoadForces
          (ChLinkMotorRotationTorque *this,double factor)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ChBodyFrame *pCVar18;
  int iVar19;
  undefined4 extraout_var;
  ulong uVar20;
  undefined4 extraout_var_00;
  Index index;
  ulong uVar21;
  ulong uVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  ChFrame<double> aframe2;
  ChFrame<double> aframe1;
  double local_168 [4];
  ulong local_148;
  double local_140;
  ChVectorRef local_138;
  ChFrame<double> local_120;
  ChFrame<double> local_98;
  
  dVar23 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
           super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime;
  local_168[3] = factor;
  (*((this->super_ChLinkMotorRotation).super_ChLinkMotor.m_func.
     super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_ChFunction[4]
  )();
  ChFrame<double>::operator>>
            (&local_98,
             &(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.frame1,
             (ChFrame<double> *)
             (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body1);
  ChFrame<double>::operator>>
            (&local_120,
             &(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.frame2,
             (ChFrame<double> *)
             (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body2);
  auVar24 = ZEXT816(0) << 0x40;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_120.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       local_120.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] * 0.0;
  auVar1 = vfmadd231sd_fma(auVar33,auVar24,auVar1);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar23;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_120.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar1 = vfmadd231sd_fma(auVar1,auVar27,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_120.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       local_120.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] * 0.0;
  auVar2 = vfmadd231sd_fma(auVar30,auVar24,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_120.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar2 = vfmadd231sd_fma(auVar2,auVar27,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_120.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       local_120.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] * 0.0;
  auVar3 = vfmadd231sd_fma(auVar35,auVar24,auVar5);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       local_120.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar3 = vfmadd231sd_fma(auVar3,auVar27,auVar24);
  pCVar18 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
            super_ChLinkMate.super_ChLink.Body2;
  local_140 = auVar2._0_8_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       local_140 *
       (pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar2 = vfmadd231sd_fma(auVar25,auVar1,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar2 = vfmadd231sd_fma(auVar2,auVar3,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       local_140 *
       (pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar4 = vfmadd231sd_fma(auVar28,auVar1,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar4 = vfmadd231sd_fma(auVar4,auVar3,auVar9);
  auVar34._0_8_ = auVar1._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       local_140 *
       (pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar1 = vfmadd231sd_fma(auVar31,auVar1,auVar10);
  local_148 = auVar3._0_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar1 = vfmadd231sd_fma(auVar1,auVar3,auVar11);
  local_168[0] = auVar2._0_8_;
  local_168[1] = auVar4._0_8_;
  local_168[2] = auVar1._0_8_;
  iVar19 = (*(pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  ChVariables::Get_fb(&local_138,(ChVariables *)CONCAT44(extraout_var,iVar19));
  if (5 < (long)local_138.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ._8_8_) {
    uVar20 = local_138.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._0_8_ + 0x18;
    uVar21 = 3;
    if (((uVar20 & 7) == 0) &&
       (uVar22 = (ulong)(-((uint)(uVar20 >> 3) & 0x1fffffff) & 7), uVar22 < 3)) {
      uVar21 = uVar22;
    }
    if (uVar21 != 0) {
      uVar22 = 0;
      do {
        *(double *)(uVar20 + uVar22 * 8) =
             *(double *)(uVar20 + uVar22 * 8) - local_168[3] * local_168[uVar22];
        uVar22 = uVar22 + 1;
      } while (uVar21 != uVar22);
    }
    if (uVar21 < 3) {
      do {
        *(double *)(uVar20 + uVar21 * 8) =
             *(double *)(uVar20 + uVar21 * 8) - local_168[3] * local_168[uVar21];
        uVar21 = uVar21 + 1;
      } while (uVar21 != 3);
    }
    pCVar18 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
              super_ChLinkMate.super_ChLink.Body1;
    auVar34._8_8_ = 0;
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         (pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar26._8_8_ = 0;
    auVar26._0_8_ =
         local_140 *
         (pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar1 = vfmadd231sd_fma(auVar26,auVar34,auVar12);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = local_148;
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         (pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar1 = vfmadd231sd_fma(auVar1,auVar36,auVar13);
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         (pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar29._8_8_ = 0;
    auVar29._0_8_ =
         local_140 *
         (pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar2 = vfmadd231sd_fma(auVar29,auVar34,auVar14);
    auVar15._8_8_ = 0;
    auVar15._0_8_ =
         (pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar2 = vfmadd231sd_fma(auVar2,auVar36,auVar15);
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         (pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar32._8_8_ = 0;
    auVar32._0_8_ =
         local_140 *
         (pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar3 = vfmadd231sd_fma(auVar32,auVar34,auVar16);
    auVar17._8_8_ = 0;
    auVar17._0_8_ =
         (pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar3 = vfmadd231sd_fma(auVar3,auVar36,auVar17);
    local_168[0] = auVar1._0_8_;
    local_168[1] = auVar2._0_8_;
    local_168[2] = auVar3._0_8_;
    iVar19 = (*(pCVar18->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
    ChVariables::Get_fb(&local_138,(ChVariables *)CONCAT44(extraout_var_00,iVar19));
    if (5 < (long)local_138.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  ._8_8_) {
      uVar20 = local_138.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._0_8_ + 0x18;
      uVar21 = 3;
      if (((uVar20 & 7) == 0) &&
         (uVar22 = (ulong)(-((uint)(uVar20 >> 3) & 0x1fffffff) & 7), uVar22 < 3)) {
        uVar21 = uVar22;
      }
      if (uVar21 != 0) {
        uVar22 = 0;
        do {
          *(double *)(uVar20 + uVar22 * 8) =
               local_168[3] * local_168[uVar22] + *(double *)(uVar20 + uVar22 * 8);
          uVar22 = uVar22 + 1;
        } while (uVar21 != uVar22);
      }
      if (uVar21 < 3) {
        do {
          *(double *)(uVar20 + uVar21 * 8) =
               local_168[3] * local_168[uVar21] + *(double *)(uVar20 + uVar21 * 8);
          uVar21 = uVar21 + 1;
        } while (uVar21 != 3);
      }
      return;
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChLinkMotorRotationTorque::ConstraintsFbLoadForces(double factor) {
    // compute instant torque
    double mT = m_func->Get_y(this->GetChTime());

    ChFrame<> aframe1 = this->frame1 >> (*this->Body1);
    ChFrame<> aframe2 = this->frame2 >> (*this->Body2);
    Vector m_abs_torque = aframe2.GetA() * ChVector<>(0, 0, mT);

    Body2->Variables().Get_fb().segment(3, 3) -= factor * Body2->TransformDirectionParentToLocal(m_abs_torque).eigen();
    Body1->Variables().Get_fb().segment(3, 3) += factor * Body1->TransformDirectionParentToLocal(m_abs_torque).eigen();
}